

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Type TVar3;
  Descriptor **v1;
  Descriptor **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  ExtensionSet *this_00;
  bool local_c2;
  LogMessage local_a8;
  Voidify local_91;
  Descriptor *local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_78;
  Voidify local_65 [20];
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  Descriptor *local_38;
  Descriptor *message_type_local;
  FieldDescriptor *pFStack_28;
  CppType cpp_type_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_38 = message_type;
  message_type_local._4_4_ = cpp_type;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd6b,"field->is_repeated()");
    local_51 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  CVar2 = FieldDescriptor::cpp_type(pFStack_28);
  absl_log_internal_check_op_result._7_1_ = 0;
  local_c2 = true;
  if (CVar2 != message_type_local._4_4_) {
    CVar2 = FieldDescriptor::cpp_type(pFStack_28);
    local_c2 = CVar2 == CPPTYPE_ENUM && message_type_local._4_4_ == CPPTYPE_INT32;
  }
  if (!local_c2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd6e,
               "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
              );
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [63])
                               "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [65])
                               "the actual field type (for enums T should be the generated enum ");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [18])"type or int32_t).");
    absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar4);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    if (local_38 != (Descriptor *)0x0) {
      v1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_38);
      local_90 = FieldDescriptor::message_type(pFStack_28);
      v2 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_90);
      local_88 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                           (v1,v2,"message_type == field->message_type()");
      if (local_88 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_88);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xd73,failure_msg);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      local_88 = (Nullable<const_char_*>)0x0;
    }
    bVar1 = FieldDescriptor::is_extension(pFStack_28);
    if (bVar1) {
      this_00 = MutableExtensionSet(this,(Message *)field_local);
      number = FieldDescriptor::number(pFStack_28);
      TVar3 = FieldDescriptor::type(pFStack_28);
      bVar1 = FieldDescriptor::is_packed(pFStack_28);
      this_local = (Reflection *)
                   internal::ExtensionSet::MutableRawRepeatedField
                             (this_00,number,(FieldType)TVar3,bVar1,pFStack_28);
    }
    else {
      this_local = (Reflection *)MutableRawNonOneof<char>(this,(Message *)field_local,pFStack_28);
    }
    return this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}